

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O2

void __thiscall
Sudoku::addDependenciesFields
          (Sudoku *this,
          vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_> *fields)

{
  int iVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  Field *pFVar6;
  int iVar7;
  long lVar8;
  SudokuType SVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  undefined1 *puVar17;
  int iVar18;
  int j;
  ulong uVar19;
  long lVar20;
  int iVar21;
  __shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2> local_90;
  __shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2> local_80;
  __shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  iVar7 = this->size_;
  if (iVar7 != 0) {
    iVar18 = this->squared_size_;
    iVar1 = 0;
    uVar13 = 0;
    iVar14 = iVar7;
    while( true ) {
      uVar16 = (uint)uVar13;
      if (iVar18 <= (int)uVar16) break;
      uVar19 = 0;
      while (uVar12 = (uint)uVar19, (int)uVar12 < iVar18) {
        for (iVar18 = 0; iVar18 < iVar14; iVar18 = iVar18 + 1) {
          iVar11 = 0;
          while( true ) {
            if (iVar14 <= iVar11) break;
            if ((iVar14 == 3) && (this->type_ == freeform)) {
              iVar14 = 3;
            }
            else {
              uVar15 = (uVar16 - (int)uVar16 % iVar14) + iVar18;
              iVar21 = iVar11 - (int)uVar12 % iVar14;
              if ((uVar15 != uVar16) || (iVar21 != 0)) {
                iVar7 = (*this->_vptr_Sudoku[7])(this,uVar13,uVar19);
                pFVar6 = (fields->
                         super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                         )._M_impl.super__Vector_impl_data._M_start[iVar7].
                         super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                iVar7 = (*this->_vptr_Sudoku[7])(this,(ulong)uVar15,(ulong)(iVar21 + uVar12));
                std::__shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                          (&local_40,
                           &(this->fields_).
                            super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[iVar7].
                            super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>);
                Field::addDependency(pFVar6,(shared_ptr<Field> *)&local_40);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&local_40._M_refcount);
                iVar14 = this->size_;
                iVar7 = iVar14;
              }
            }
            uVar15 = iVar14 * iVar18 + iVar11;
            if (uVar15 + iVar1 != 0) {
              iVar7 = (*this->_vptr_Sudoku[7])(this,uVar13,uVar19);
              pFVar6 = (fields->
                       super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[iVar7].
                       super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              iVar7 = (*this->_vptr_Sudoku[7])(this,(ulong)uVar15,uVar19);
              std::__shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        (&local_50,
                         &(this->fields_).
                          super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar7].
                          super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>);
              Field::addDependency(pFVar6,(shared_ptr<Field> *)&local_50);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_50._M_refcount);
              iVar7 = this->size_;
              uVar15 = iVar18 * iVar7 + iVar11;
            }
            if (uVar15 != uVar12) {
              iVar7 = (*this->_vptr_Sudoku[7])(this,uVar13,uVar19);
              pFVar6 = (fields->
                       super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[iVar7].
                       super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              iVar7 = (*this->_vptr_Sudoku[7])(this,uVar13,(ulong)uVar15);
              std::__shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        (&local_60,
                         &(this->fields_).
                          super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar7].
                          super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>);
              Field::addDependency(pFVar6,(shared_ptr<Field> *)&local_60);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_60._M_refcount);
              iVar7 = this->size_;
            }
            iVar11 = iVar11 + 1;
            iVar14 = iVar7;
          }
        }
        iVar18 = this->squared_size_;
        uVar19 = (ulong)(uVar12 + 1);
      }
      uVar13 = (ulong)(uVar16 + 1);
      iVar1 = iVar1 + -1;
    }
    SVar9 = this->type_;
    if (SVar9 == diagonal) {
      for (uVar16 = 0; (int)uVar16 < iVar18; uVar16 = uVar16 + 1) {
        uVar13 = 0;
        while (uVar12 = (uint)uVar13, (int)uVar12 < iVar18) {
          if (uVar12 != uVar16) {
            iVar7 = (*this->_vptr_Sudoku[7])(this,(ulong)uVar16,(ulong)uVar16);
            pFVar6 = (fields->
                     super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[iVar7].
                     super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            iVar7 = (*this->_vptr_Sudoku[7])(this,uVar13,uVar13);
            std::__shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_70,
                       &(this->fields_).
                        super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[iVar7].
                        super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>);
            Field::addDependency(pFVar6,(shared_ptr<Field> *)&local_70);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
            iVar7 = (*this->_vptr_Sudoku[7])
                              (this,(ulong)uVar16,(ulong)(this->squared_size_ + ~uVar16));
            pFVar6 = (fields->
                     super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[iVar7].
                     super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            iVar7 = (*this->_vptr_Sudoku[7])(this,uVar13,(ulong)(~uVar12 + this->squared_size_));
            std::__shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_80,
                       &(this->fields_).
                        super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[iVar7].
                        super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>);
            Field::addDependency(pFVar6,(shared_ptr<Field> *)&local_80);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
            iVar18 = this->squared_size_;
          }
          uVar13 = (ulong)(uVar12 + 1);
        }
      }
      SVar9 = this->type_;
      iVar14 = this->size_;
    }
    if ((SVar9 == freeform) && (iVar14 == 3)) {
      puVar17 = &DAT_001210d1;
      for (lVar8 = 0; lVar8 != 9; lVar8 = lVar8 + 1) {
        for (lVar10 = 0; lVar10 != 9; lVar10 = lVar10 + 1) {
          cVar2 = (&DAT_001210d0)[lVar10 * 2 + lVar8 * 0x12];
          cVar3 = (&DAT_001210d1)[lVar10 * 2 + lVar8 * 0x12];
          for (lVar20 = 0; lVar20 != 9; lVar20 = lVar20 + 1) {
            cVar4 = puVar17[lVar20 * 2 + -1];
            cVar5 = puVar17[lVar20 * 2];
            if ((cVar4 != cVar2) || (cVar5 != cVar3)) {
              iVar7 = (*this->_vptr_Sudoku[7])(this);
              pFVar6 = (fields->
                       super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[iVar7].
                       super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              iVar7 = (*this->_vptr_Sudoku[7])(this,(ulong)(uint)(int)cVar4,(ulong)(uint)(int)cVar5)
              ;
              std::__shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        (&local_90,
                         &(this->fields_).
                          super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar7].
                          super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>);
              Field::addDependency(pFVar6,(shared_ptr<Field> *)&local_90);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_90._M_refcount);
            }
          }
        }
        puVar17 = puVar17 + 0x12;
      }
    }
  }
  return;
}

Assistant:

void Sudoku::addDependenciesFields(std::vector<std::shared_ptr<Field>> &fields)
{
  if(size_ == 0)
    return;

  //add dependencies
  // loop over all fields
  for(int x = 0; x < squared_size_; x++)    // x,y: global index of field for which dependencies are added
  {
    for (int y = 0; y < squared_size_; y++)
    {
      // loop over all fields in same block3x3
      for (int field3x3_x = 0; field3x3_x < size_; field3x3_x++)  // field3x3_x, field3x3_y: local index in own block3x3
      {
        for (int field3x3_y = 0; field3x3_y < size_; field3x3_y++)
        {

          int block3x3_no_x = int(x / size_);     // own index of block3x3
          int block3x3_no_y = int(y / size_);

          //add dependencies to all of 3x3 block
          if(type_ != SudokuType::freeform || size_ != 3)
          {
            int dependency_x = block3x3_no_x*size_ + field3x3_x;
            int dependency_y = block3x3_no_y*size_ + field3x3_y;

            if(dependency_x != x || dependency_y != y)
              fields[index(x,y)]->addDependency(fields_[index(dependency_x,dependency_y)]);
          }

          //add dependencies to all of row
          int dependency_x = field3x3_x*size_ + field3x3_y;   // this is actually an own loop over x=0..squared_size
          int dependency_y = y;

          if(dependency_x != x || dependency_y != y)
            fields[index(x,y)]->addDependency(fields_[index(dependency_x,dependency_y)]);

          //add dependencies to all of column
          dependency_x = x;
          dependency_y = field3x3_x*size_ + field3x3_y; // this is actually an own loop over y=0..squared_size

          if(dependency_x != x || dependency_y != y)
            fields[index(x,y)]->addDependency(fields_[index(dependency_x,dependency_y)]);
        }
      }
    }
  }

  // add diagonal dependencies
  if(type_ == SudokuType::diagonal)
  {
    for(int i = 0; i < squared_size_; i++)
    {
      for(int j = 0; j < squared_size_; j++)
      {
        // diagonal lower left to upper right
        if(i != j)
          fields[index(i,i)]->addDependency(fields_[index(j,j)]);

        // diagonal upper left to lower right
        if(i != j)
          fields[index(i,squared_size_-1-i)]->addDependency(fields_[index(j,squared_size_-1-j)]);
      }
    }
  }

  // add block dependencies for freeform
  if(type_ == SudokuType::freeform && size_ == 3)
  {
    // center block
    char block[][9][2] = {
      {{3,3}, {4,3}, {5,3}, {3,4}, {4,4}, {5,4}, {3,5}, {4,5}, {5,5}},    // center block
      {{0,0}, {1,0}, {3,2}, {0,1}, {1,1}, {2,1}, {2,3}, {1,2}, {2,2}},    // lower left block
      {{3,0}, {4,0}, {5,0}, {3,1}, {4,1}, {5,1}, {2,0}, {4,2}, {6,0}},    // bottom block
      {{5,2}, {7,0}, {8,0}, {6,1}, {7,1}, {8,1}, {6,2}, {7,2}, {6,3}},    // lower right block
      {{8,2}, {7,3}, {8,3}, {6,4}, {7,4}, {8,4}, {8,6}, {7,5}, {8,5}},    // right block
      {{6,6}, {7,6}, {6,5}, {6,7}, {7,7}, {8,7}, {5,6}, {7,8}, {8,8}},    // upper right block
      {{2,8}, {4,6}, {6,8}, {3,7}, {4,7}, {5,7}, {3,8}, {4,8}, {5,8}},    // top block
      {{2,5}, {1,6}, {2,6}, {0,7}, {1,7}, {2,7}, {0,8}, {1,8}, {3,6}},    // upper left block
      {{0,3}, {1,3}, {0,2}, {0,4}, {1,4}, {2,4}, {0,5}, {1,5}, {0,6}}};   // left block

    for(int block_no = 0; block_no < 9; block_no++)
    {
      for(int i = 0; i < 9; i++)
      {
        int x = block[block_no][i][0];
        int y = block[block_no][i][1];

        for(int j = 0; j < 9; j++)
        {
          int dependency_x = block[block_no][j][0];
          int dependency_y = block[block_no][j][1];

          if(dependency_x != x || dependency_y != y)
          {
            fields[index(x,y)]->addDependency(fields_[index(dependency_x,dependency_y)]);
          }
        }
      }
    }
  }

}